

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_ping_pong.c
# Opt level: O0

int main(int argc,char **argv)

{
  cio_error cVar1;
  cio_address_family family;
  __sighandler_t p_Var2;
  cio_inet_address *inet_address;
  undefined1 local_360 [8];
  client client;
  cio_socket socket;
  cio_server_socket server_socket;
  undefined1 local_90 [4];
  cio_error err;
  cio_socket_address endpoint;
  int ret;
  char **argv_local;
  int argc_local;
  
  unique0x1000029b = argv;
  if (argc == 2) {
    max_pings = strtoul(argv[1],(char **)0x0,10);
    if (max_pings == 0xffffffffffffffff) {
      usage(*stack0xffffffffffffffe8);
      argv_local._4_4_ = 1;
    }
    else {
      endpoint.impl.sa._104_4_ = 0;
      p_Var2 = signal(0xf,sighandler);
      if (p_Var2 == (__sighandler_t)0xffffffffffffffff) {
        fprintf(_stderr,"could no install SIGTERM handler!\n");
        argv_local._4_4_ = 1;
      }
      else {
        p_Var2 = signal(2,sighandler);
        if (p_Var2 == (__sighandler_t)0xffffffffffffffff) {
          fprintf(_stderr,"could no install SIGINT handler!\n");
          signal(0xf,(__sighandler_t)0x0);
          argv_local._4_4_ = 1;
        }
        else {
          inet_address = cio_get_inet_address_any4();
          cVar1 = cio_init_inet_socket_address((cio_socket_address *)local_90,inet_address,0x3039);
          if (cVar1 == CIO_SUCCESS) {
            cVar1 = cio_eventloop_init(&loop);
            if (cVar1 == CIO_SUCCESS) {
              cVar1 = init_server((cio_server_socket *)&socket.impl.peer_closed_connection,
                                  (cio_socket_address *)local_90);
              if (cVar1 == CIO_SUCCESS) {
                local_360 = (undefined1  [8])0x0;
                client.bytes_read = 0;
                family = cio_socket_address_get_family((cio_socket_address *)local_90);
                cVar1 = init_client((cio_socket *)(client.buffer + 0x78),family,(client *)local_360)
                ;
                if (cVar1 == CIO_SUCCESS) {
                  cVar1 = cio_eventloop_run(&loop);
                  if (cVar1 != CIO_SUCCESS) {
                    endpoint.impl.sa._104_4_ = 1;
                  }
                }
                else {
                  endpoint.impl.sa._104_4_ = 1;
                }
                cio_server_socket_close((cio_server_socket *)&socket.impl.peer_closed_connection);
              }
              cio_eventloop_destroy(&loop);
              argv_local._4_4_ = endpoint.impl.sa._104_4_;
            }
            else {
              argv_local._4_4_ = 1;
            }
          }
          else {
            fprintf(_stderr,"could no init server socket endpoint!\n");
            argv_local._4_4_ = 1;
          }
        }
      }
    }
  }
  else {
    usage(*argv);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc != 2) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	max_pings = strtoul(argv[1], NULL, BASE_10);
	if (max_pings == ULLONG_MAX) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	int ret = EXIT_SUCCESS;
	if (signal(SIGTERM, sighandler) == SIG_ERR) {
		(void)fprintf(stderr, "could no install SIGTERM handler!\n");
		return EXIT_FAILURE;
	}

	if (signal(SIGINT, sighandler) == SIG_ERR) {
		(void)fprintf(stderr, "could no install SIGINT handler!\n");
		(void)signal(SIGTERM, SIG_DFL);
		return EXIT_FAILURE;
	}

	struct cio_socket_address endpoint;
	enum cio_error err = cio_init_inet_socket_address(&endpoint, cio_get_inet_address_any4(), SERVERSOCKET_LISTEN_PORT);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could no init server socket endpoint!\n");
		return EXIT_FAILURE;
	}

	err = cio_eventloop_init(&loop);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return EXIT_FAILURE;
	}

	struct cio_server_socket server_socket;
	err = init_server(&server_socket, &endpoint);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto destroy_loop;
	}

	struct cio_socket socket;
	struct client client;
	client.bytes_read = 0;
	client.number_of_pings = 0;
	err = init_client(&socket, cio_socket_address_get_family(&endpoint), &client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	err = cio_eventloop_run(&loop);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
	}

close_server_socket:
	cio_server_socket_close(&server_socket);
destroy_loop:
	cio_eventloop_destroy(&loop);
	return ret;
}